

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.h
# Opt level: O0

double __thiscall
BayesianGameForDecPOMDPStage::GetImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI,
          FactoredDecPOMDPDiscreteInterface *fd)

{
  const_reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RCX;
  size_type in_RDI;
  Index in_stack_00000048;
  Index in_stack_0000004c;
  BayesianGameForDecPOMDPStage *in_stack_00000050;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 0x130) & 1) == 0) {
    local_8 = ComputeImmediateReward(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
  }
  else {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)in_RCX,in_RDI);
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(in_RCX,in_RDI);
    local_8 = *pvVar1;
  }
  return local_8;
}

Assistant:

double GetImmediateReward(Index jtI, Index jaI,
                                  const FactoredDecPOMDPDiscreteInterface* fd=0) const
        {
            if(_m_areCachedImmediateRewards)
                return _m_immR.at(jtI).at(jaI);
            else
                return ComputeImmediateReward(jtI, jaI);
        }